

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_handle_pHYs(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  char *error_message;
  png_byte buf [9];
  uint local_19;
  uint local_15;
  byte local_11;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 4) == 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x80) == 0)) {
      if (length == 9) {
        png_crc_read(png_ptr,(png_bytep)&local_19,9);
        iVar1 = png_crc_finish(png_ptr,0);
        if (iVar1 == 0) {
          png_set_pHYs(png_ptr,info_ptr,
                       local_19 >> 0x18 | (local_19 & 0xff0000) >> 8 | (local_19 & 0xff00) << 8 |
                       local_19 << 0x18,
                       local_15 >> 0x18 | (local_15 & 0xff0000) >> 8 | (local_15 & 0xff00) << 8 |
                       local_15 << 0x18,(uint)local_11);
        }
        return;
      }
      png_crc_finish(png_ptr,length);
      error_message = "invalid";
    }
    else {
      png_crc_finish(png_ptr,length);
      error_message = "duplicate";
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_pHYs(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[9];
   png_uint_32 res_x, res_y;
   int unit_type;

   png_debug(1, "in png_handle_pHYs");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_pHYs) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (length != 9)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 9);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   res_x = png_get_uint_32(buf);
   res_y = png_get_uint_32(buf + 4);
   unit_type = buf[8];
   png_set_pHYs(png_ptr, info_ptr, res_x, res_y, unit_type);
}